

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O1

SeqEntry * __thiscall
ECdecoding::checkCandidate
          (SeqEntry *__return_storage_ptr__,ECdecoding *this,SeqEntry *can,unsigned_long threshold)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer other;
  pointer pSVar3;
  SeqEntry *bestCan;
  ulong uVar4;
  
  std::vector<SeqEntry,_std::allocator<SeqEntry>_>::push_back(&this->candidates,can);
  other = (this->candidates).super__Vector_base<SeqEntry,_std::allocator<SeqEntry>_>._M_impl.
          super__Vector_impl_data._M_start;
  pSVar1 = (this->candidates).super__Vector_base<SeqEntry,_std::allocator<SeqEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = ((long)pSVar1 - (long)other >> 5) * -0x79435e50d79435e5;
  if (uVar4 < threshold || uVar4 - threshold == 0) {
    this->endFailed = true;
    other = can;
  }
  else {
    pSVar3 = other + 1;
    if (pSVar3 != pSVar1 && other != pSVar1) {
      do {
        pSVar2 = pSVar3;
        if (other->metric <= pSVar3->metric) {
          pSVar2 = other;
        }
        other = pSVar2;
        pSVar3 = pSVar3 + 1;
      } while (pSVar3 != pSVar1);
    }
  }
  SeqEntry::SeqEntry(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

SeqEntry ECdecoding::checkCandidate(SeqEntry &can, unsigned long threshold) {
    candidates.push_back(can);
    if (candidates.size() > threshold) {
        SeqEntry bestCan = *min_element(candidates.begin(), candidates.end());
        DEBUG("Final candidate: " << bestCan.seq);
        return bestCan;
    } else {
        endFailed = true;
        return can;
    }
}